

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,StackVar *sv)

{
  pointer pTVar1;
  SymbolSet *set;
  char cVar2;
  char cVar3;
  iterator iVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  uint uVar8;
  undefined1 in_R8B;
  char *pcVar9;
  uint __val;
  ulong uVar10;
  Type type;
  string_view name_00;
  string_view proposed_name;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  string __str;
  string name;
  StackTypePair stp;
  undefined8 local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  CWriter *local_98;
  long local_90;
  long lStack_88;
  string local_80;
  string local_60;
  key_type local_3c;
  
  pTVar1 = (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3;
  uVar10 = ~(ulong)sv->index + uVar6;
  type = sv->type;
  __val = (uint)uVar10;
  if (type.enum_ == Any) {
    if (uVar6 <= (uVar10 & 0xffffffff)) {
      __assert_fail("index < type_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x4bd,"void wabt::(anonymous namespace)::CWriter::Write(const StackVar &)");
    }
    type = pTVar1[uVar10 & 0xffffffff];
  }
  local_3c.first = __val;
  local_3c.second = type;
  iVar4 = std::
          _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->stack_var_sym_map_)._M_t,&local_3c);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header) {
    MangleType(type);
    cVar3 = '\x01';
    if (9 < __val) {
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        uVar8 = (uint)uVar10;
        if (uVar8 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_00149fe2;
        }
        if (uVar8 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_00149fe2;
        }
        if (uVar8 < 10000) goto LAB_00149fe2;
        uVar10 = (uVar10 & 0xffffffff) / 10000;
        cVar2 = cVar3 + '\x04';
      } while (99999 < uVar8);
      cVar3 = cVar3 + '\x01';
    }
LAB_00149fe2:
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c0,local_b8,__val);
    plVar5 = (long *)std::__cxx11::string::insert((ulong)&local_c0,0,'\x01');
    local_a0 = &local_90;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_90 = *plVar7;
      lStack_88 = plVar5[3];
    }
    else {
      local_90 = *plVar7;
      local_a0 = (long *)*plVar5;
    }
    local_98 = (CWriter *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    name_00._M_str = (char *)0x0;
    name_00._M_len = (size_t)local_a0;
    (anonymous_namespace)::CWriter::Mangle_abi_cxx11_(&local_60,local_98,name_00,(bool)in_R8B);
    pcVar9 = (char *)0x4;
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x170e7c);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_b0 = *plVar7;
      lStack_a8 = plVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar7;
      local_c0 = (long *)*plVar5;
    }
    set = (SymbolSet *)plVar5[1];
    local_b8 = (uint)set;
    uStack_b4 = (undefined4)((ulong)set >> 0x20);
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    proposed_name._M_str = pcVar9;
    proposed_name._M_len = (size_t)local_c0;
    FindUniqueName(&local_80,(CWriter *)&this->local_syms_,set,proposed_name);
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_c0._4_4_ = type.enum_;
    local_b8 = type.type_index_;
    local_c0._0_4_ = __val;
    pVar11 = std::
             _Rb_tree<std::pair<unsigned_int,wabt::Type>,std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
             ::_M_emplace_unique<std::pair<unsigned_int,wabt::Type>&,std::__cxx11::string&>
                       ((_Rb_tree<std::pair<unsigned_int,wabt::Type>,std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>,std::less<std::pair<unsigned_int,wabt::Type>>,std::allocator<std::pair<std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>>>
                         *)&this->stack_var_sym_map_,(pair<unsigned_int,_wabt::Type> *)&local_c0,
                        &local_80);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("success",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x3fc,
                    "std::string wabt::(anonymous namespace)::CWriter::DefineStackVarName(Index, Type, std::string_view)"
                   );
    }
    WriteData(this,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
  }
  else {
    WriteData(this,(char *)iVar4._M_node[1]._M_left,(size_t)iVar4._M_node[1]._M_right);
  }
  return;
}

Assistant:

void CWriter::Write(const StackVar& sv) {
  Index index = type_stack_.size() - 1 - sv.index;
  Type type = sv.type;
  if (type == Type::Any) {
    assert(index < type_stack_.size());
    type = type_stack_[index];
  }

  StackTypePair stp = {index, type};
  auto iter = stack_var_sym_map_.find(stp);
  if (iter == stack_var_sym_map_.end()) {
    std::string name = MangleType(type) + std::to_string(index);
    Write(DefineStackVarName(index, type, name));
  } else {
    Write(iter->second);
  }
}